

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O1

void __thiscall Fl_Table::recalc_dimensions(Fl_Table *this)

{
  int iVar1;
  int iVar2;
  _func_int **pp_Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar7 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar6 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar6 = iVar6 + iVar7;
  this->wix = iVar6;
  this->tox = iVar6;
  iVar7 = Fl::box_dx((uint)(this->table->super_Fl_Group).super_Fl_Widget.box_);
  this->tix = iVar7 + iVar6;
  iVar7 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar6 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar6 = iVar6 + iVar7;
  this->wiy = iVar6;
  this->toy = iVar6;
  iVar7 = Fl::box_dy((uint)(this->table->super_Fl_Group).super_Fl_Widget.box_);
  this->tiy = iVar7 + iVar6;
  iVar7 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar6 = Fl::box_dw((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar7 = iVar7 - iVar6;
  this->wiw = iVar7;
  this->tow = iVar7;
  iVar6 = Fl::box_dw((uint)(this->table->super_Fl_Group).super_Fl_Widget.box_);
  this->tiw = iVar7 - iVar6;
  iVar7 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar6 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar7 = iVar7 - iVar6;
  this->wih = iVar7;
  this->toh = iVar7;
  iVar6 = Fl::box_dh((uint)(this->table->super_Fl_Group).super_Fl_Widget.box_);
  this->tih = iVar7 - iVar6;
  if (this->_col_header != '\0') {
    iVar1 = this->_col_header_h;
    this->tiy = this->tiy + iVar1;
    this->toy = this->toy + iVar1;
    this->tih = (iVar7 - iVar6) - iVar1;
    this->toh = this->toh - iVar1;
  }
  if (this->_row_header != '\0') {
    iVar7 = this->_row_header_w;
    this->tix = this->tix + iVar7;
    this->tox = this->tox + iVar7;
    this->tiw = this->tiw - iVar7;
    this->tow = this->tow - iVar7;
  }
  iVar6 = this->table_w;
  iVar1 = this->table_h;
  iVar7 = this->tih;
  bVar4 = iVar1 <= iVar7;
  iVar2 = this->tiw;
  bVar5 = iVar6 <= iVar2;
  iVar8 = Fl::scrollbar_size();
  if (iVar2 < iVar6 && iVar1 <= iVar7) {
    bVar4 = (this->table_h + iVar8) - this->tih < 1;
  }
  if ((bool)(~bVar4 & iVar6 <= iVar2)) {
    bVar5 = (this->table_w + iVar8) - this->tiw < 1;
  }
  pp_Var3 = (this->vscrollbar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget;
  if (bVar4) {
    (*pp_Var3[6])();
  }
  else {
    (*pp_Var3[5])();
    this->tiw = this->tiw - iVar8;
    this->tow = this->tow - iVar8;
  }
  pp_Var3 = (this->hscrollbar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget;
  if (bVar5) {
    (*pp_Var3[6])();
  }
  else {
    (*pp_Var3[5])();
    this->tih = this->tih - iVar8;
    this->toh = this->toh - iVar8;
  }
  (*(this->table->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
            (this->table,(ulong)(uint)this->tox,(ulong)(uint)this->toy,(ulong)(uint)this->tow,
             (ulong)(uint)this->toh);
  Fl_Group::init_sizes(&this->table->super_Fl_Group);
  return;
}

Assistant:

void Fl_Table::recalc_dimensions() {
  // Recalc to* (Table Outer), ti* (Table Inner), wi* ( Widget Inner)
  wix = ( x() + Fl::box_dx(box())); tox = wix; tix = tox + Fl::box_dx(table->box());
  wiy = ( y() + Fl::box_dy(box())); toy = wiy; tiy = toy + Fl::box_dy(table->box());
  wiw = ( w() - Fl::box_dw(box())); tow = wiw; tiw = tow - Fl::box_dw(table->box());
  wih = ( h() - Fl::box_dh(box())); toh = wih; tih = toh - Fl::box_dh(table->box());
  // Trim window if headers enabled
  if ( col_header() ) {
    tiy += col_header_height(); toy += col_header_height();
    tih -= col_header_height(); toh -= col_header_height();
  }
  if ( row_header() ) {
    tix += row_header_width(); tox += row_header_width();
    tiw -= row_header_width(); tow -= row_header_width();
  } 
  // Make scroll bars disappear if window large enough
  {
    // First pass: can hide via window size?
    int hidev = (table_h <= tih);
    int hideh = (table_w <= tiw); 
#if FLTK_ABI_VERSION >= 10301
    // NEW
    int scrollsize = _scrollbar_size ? _scrollbar_size : Fl::scrollbar_size();
#else
    // OLD
    int scrollsize = Fl::scrollbar_size();
#endif
    // Second pass: Check for interference
    if ( !hideh && hidev ) { hidev = (( table_h - tih + scrollsize ) <= 0 ); }
    if ( !hidev && hideh ) { hideh = (( table_w - tiw + scrollsize ) <= 0 ); }
    // Determine scrollbar visibility, trim ti[xywh]/to[xywh]
    if ( hidev ) { vscrollbar->hide(); }
    else { vscrollbar->show(); tiw -= scrollsize; tow -= scrollsize; }
    if ( hideh ) { hscrollbar->hide(); }
    else { hscrollbar->show(); tih -= scrollsize; toh -= scrollsize; }
  }
  // Resize the child table
  table->resize(tox, toy, tow, toh);
  table->init_sizes();
}